

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::minorUpdateRows(HEkkDual *this)

{
  __atomic_base<int> _Var1;
  HVectorBase<double> *pivot;
  element_type *peVar2;
  bool bVar3;
  uint uVar4;
  HVectorBase<double> *this_00;
  char *pcVar5;
  HighsSplitDeque *pHVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t uVar10;
  uint end;
  long lVar11;
  MChoice *pMVar12;
  uint end_00;
  vector<double,_std::allocator<double>_> *pvVar13;
  double dVar14;
  TaskGroup tg;
  anon_class_24_4_3f80b2e7_for_functor local_120;
  MChoice *local_108;
  HVector *Row;
  anon_class_32_4_068a6c9c local_f8;
  HighsInt multi_iwhich [8];
  double multi_xpivot [8];
  HVector_ptr multi_vector [8];
  
  end_00 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x48,0);
  pivot = this->multi_finish[this->multi_nFinish].row_ep;
  Row = pivot;
  if ((pivot->count < 0) || ((double)this->solver_num_row * 0.1 < (double)pivot->count)) {
    pvVar13 = &this->multi_choice[0].row_ep.array;
    for (lVar11 = 0; lVar11 < this->multi_num; lVar11 = lVar11 + 1) {
      if (-1 < *(int *)((long)(pvVar13 + -4) + 8)) {
        dVar14 = HighsSparseMatrix::computeDot(this->a_matrix,pvVar13,this->variable_in);
        if (1e-14 <= ABS(dVar14)) {
          multi_vector[(int)end_00] = (HVector_ptr)((long)(pvVar13 + -2) + 0x10);
          multi_xpivot[(int)end_00] = -dVar14 / this->alpha_row;
          multi_iwhich[(int)end_00] = (HighsInt)lVar11;
          end_00 = end_00 + 1;
        }
      }
      pvVar13 = (vector<double,_std::allocator<double>_> *)((long)(pvVar13 + 0x18) + 8);
    }
    local_f8.multi_vector = &multi_vector;
    local_f8.multi_xpivot = &multi_xpivot;
    local_f8.Row = &Row;
    local_f8.this = this;
    if ((int)end_00 < 2) {
      minorUpdateRows::anon_class_32_4_068a6c9c::operator()(&local_f8,0,end_00);
      pMVar12 = this->multi_choice;
    }
    else {
      local_108 = this->multi_choice;
      tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
      tg.dequeHead = ((tg.workerDeque)->ownerData).head;
      uVar4 = end_00;
      do {
        pHVar6 = tg.workerDeque;
        end = uVar4 >> 1;
        local_120.grainSize = 1;
        uVar7 = ((tg.workerDeque)->ownerData).head;
        uVar8 = (ulong)uVar7;
        local_120.split = end;
        local_120.end = uVar4;
        local_120.f = (anon_class_32_4_8f8caa33 *)&local_f8;
        if (uVar8 < 0x2000) {
          uVar10 = (uint32_t)(uVar8 + 1);
          ((tg.workerDeque)->ownerData).head = uVar10;
          ((tg.workerDeque)->taskArray)._M_elems[uVar8].metadata.stealer.
          super___atomic_base<unsigned_long>._M_i = 0;
          *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar8].taskData =
               &PTR_operator___00433578;
          *(anon_class_32_4_068a6c9c **)
           (((tg.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0x18) = &local_f8;
          pcVar5 = ((tg.workerDeque)->taskArray)._M_elems[uVar8].taskData;
          *(ulong *)(pcVar5 + 8) = CONCAT44(uVar4,end);
          *(ulong *)(pcVar5 + 0x10) = CONCAT44(local_120._12_4_,1);
          if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
            ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                 uVar8 << 0x20 | uVar8 + 1;
            ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
            ((tg.workerDeque)->ownerData).splitCopy = uVar10;
            ((tg.workerDeque)->ownerData).allStolenCopy = false;
            if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
              ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
            }
            peVar2 = ((tg.workerDeque)->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            LOCK();
            _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
            (peVar2->haveJobs).super___atomic_base<int>._M_i =
                 (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
              HighsSplitDeque::WorkerBunk::publishWork
                        (((tg.workerDeque)->ownerData).workerBunk.
                         super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,tg.workerDeque);
            }
          }
          else {
            HighsSplitDeque::growShared(tg.workerDeque);
          }
        }
        else {
          if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
             (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
            HighsSplitDeque::growShared(tg.workerDeque);
            uVar7 = (pHVar6->ownerData).head;
          }
          (pHVar6->ownerData).head = uVar7 + 1;
          HighsTask::
          Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
          ::anon_class_24_4_3f80b2e7_for_functor::operator()(&local_120);
        }
        bVar3 = 3 < uVar4;
        uVar4 = end;
      } while (bVar3);
      minorUpdateRows::anon_class_32_4_068a6c9c::operator()(&local_f8,0,end);
      ::highs::parallel::TaskGroup::taskWait(&tg);
      ::highs::parallel::TaskGroup::~TaskGroup(&tg);
      pMVar12 = local_108;
    }
    if (this->edge_weight_mode == kSteepestEdge) {
      uVar9 = 0;
      uVar8 = (ulong)end_00;
      if ((int)end_00 < 1) {
        uVar8 = uVar9;
      }
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        pMVar12[multi_iwhich[uVar9]].infeasEdWt = multi_xpivot[uVar9];
      }
    }
  }
  else {
    pvVar13 = &this->multi_choice[0].row_ep.array;
    for (lVar11 = 0; lVar11 < this->multi_num; lVar11 = lVar11 + 1) {
      if (-1 < *(int *)((long)(pvVar13 + -4) + 8)) {
        dVar14 = HighsSparseMatrix::computeDot(this->a_matrix,pvVar13,this->variable_in);
        if (1e-14 <= ABS(dVar14)) {
          this_00 = (HVectorBase<double> *)((long)(pvVar13 + -2) + 0x10);
          HVectorBase<double>::saxpy<double,double>(this_00,-dVar14 / this->alpha_row,pivot);
          HVectorBase<double>::tight(this_00);
          if (this->edge_weight_mode == kSteepestEdge) {
            dVar14 = HVectorBase<double>::norm2(this_00);
            *(double *)(pvVar13 + -2) = dVar14;
          }
        }
      }
      pvVar13 = (vector<double,_std::allocator<double>_> *)((long)(pvVar13 + 0x18) + 8);
    }
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x48,0);
  return;
}

Assistant:

void HEkkDual::minorUpdateRows() {
  analysis->simplexTimerStart(UpdateRowClock);
  const HVector* Row = multi_finish[multi_nFinish].row_ep;
  HighsInt updateRows_inDense =
      (Row->count < 0) || (Row->count > 0.1 * solver_num_row);
  if (updateRows_inDense) {
    HighsInt multi_nTasks = 0;
    HighsInt multi_iwhich[kSimplexConcurrencyLimit];
    double multi_xpivot[kSimplexConcurrencyLimit];
    HVector_ptr multi_vector[kSimplexConcurrencyLimit];

    /*
     * Dense mode
     *  1. Find which ones to do and the pivotX
     *  2. Do all of them in task parallel
     */

    // Collect tasks
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        HVector* next_ep = &multi_choice[ich].row_ep;
        double pivotX = a_matrix->computeDot(*next_ep, variable_in);
        if (fabs(pivotX) < kHighsTiny) continue;
        multi_vector[multi_nTasks] = next_ep;
        multi_xpivot[multi_nTasks] = -pivotX / alpha_row;
        multi_iwhich[multi_nTasks] = ich;
        multi_nTasks++;
      }
    }

    // Perform tasks
    // #pragma omp parallel for schedule(dynamic)
    // printf("minorUpdatesRows: starting %d tasks\n", multi_nTasks);
    highs::parallel::for_each(
        0, multi_nTasks, [&](HighsInt start, HighsInt end) {
          for (HighsInt i = start; i < end; i++) {
            HVector_ptr nextEp = multi_vector[i];
            const double xpivot = multi_xpivot[i];
            nextEp->saxpy(xpivot, Row);
            nextEp->tight();
            if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
              multi_xpivot[i] = nextEp->norm2();
            }
          }
        });

    // Put weight back
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      for (HighsInt i = 0; i < multi_nTasks; i++)
        multi_choice[multi_iwhich[i]].infeasEdWt = multi_xpivot[i];
    }
  } else {
    // Sparse mode: just do it sequentially
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        HVector* next_ep = &multi_choice[ich].row_ep;
        double pivotX = a_matrix->computeDot(*next_ep, variable_in);
        if (fabs(pivotX) < kHighsTiny) continue;
        next_ep->saxpy(-pivotX / alpha_row, Row);
        next_ep->tight();
        if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
          multi_choice[ich].infeasEdWt = next_ep->norm2();
        }
      }
    }
  }
  analysis->simplexTimerStop(UpdateRowClock);
}